

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::IssueMessage(cmLocalGenerator *this,MessageType t,string *text)

{
  bool bVar1;
  char *pcVar2;
  cmake *pcVar3;
  string local_d8;
  cmState *local_b8;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_b0;
  PositionType local_a8;
  undefined1 local_98 [8];
  cmOutputConverter converter;
  undefined1 local_68 [8];
  cmListFileContext lfc;
  string *text_local;
  MessageType t_local;
  cmLocalGenerator *this_local;
  
  lfc.Line = (long)text;
  cmListFileContext::cmListFileContext((cmListFileContext *)local_68);
  pcVar2 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),pcVar2);
  std::__cxx11::string::operator+=((string *)(lfc.Name.field_2._M_local_buf + 8),"/CMakeLists.txt");
  pcVar3 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  bVar1 = cmake::GetIsInTryCompile(pcVar3);
  if (!bVar1) {
    local_a8 = (this->StateSnapshot).Position.Position;
    local_b8 = (this->StateSnapshot).State;
    pcStack_b0 = (this->StateSnapshot).Position.Tree;
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_98,this->StateSnapshot);
    cmOutputConverter::Convert
              (&local_d8,(cmOutputConverter *)local_98,(string *)((long)&lfc.Name.field_2 + 8),HOME,
               UNCHANGED);
    std::__cxx11::string::operator=
              ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  lfc.FilePath.field_2._8_8_ = 0;
  pcVar3 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  cmake::IssueMessage(pcVar3,t,(string *)lfc.Line,(cmListFileContext *)local_68);
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_68);
  return;
}

Assistant:

void cmLocalGenerator::IssueMessage(cmake::MessageType t,
                                    std::string const& text) const
{
  cmListFileContext lfc;
  lfc.FilePath = this->StateSnapshot.GetCurrentSourceDirectory();
  lfc.FilePath += "/CMakeLists.txt";

  if(!this->GlobalGenerator->GetCMakeInstance()->GetIsInTryCompile())
    {
    cmOutputConverter converter(this->StateSnapshot);
    lfc.FilePath = converter.Convert(lfc.FilePath, cmLocalGenerator::HOME);
    }
  lfc.Line = 0;
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(t, text, lfc);
}